

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLUtils.h
# Opt level: O0

void COLLADASaxFWL::deleteVectorFW<COLLADAFW::Joint*>
               (vector<COLLADAFW::Joint_*,_std::allocator<COLLADAFW::Joint_*>_> *list)

{
  size_type sVar1;
  const_reference ppJVar2;
  vector<COLLADAFW::Joint_*,_std::allocator<COLLADAFW::Joint_*>_> *in_RDI;
  Joint *listItem;
  size_t count;
  size_t i;
  ulong local_10;
  
  local_10 = 0;
  sVar1 = std::vector<COLLADAFW::Joint_*,_std::allocator<COLLADAFW::Joint_*>_>::size(in_RDI);
  for (; local_10 < sVar1; local_10 = local_10 + 1) {
    ppJVar2 = std::vector<COLLADAFW::Joint_*,_std::allocator<COLLADAFW::Joint_*>_>::operator[]
                        (in_RDI,local_10);
    if (*ppJVar2 != (value_type)0x0) {
      (*((*ppJVar2)->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1004>).super_Object.
        _vptr_Object[1])();
    }
  }
  return;
}

Assistant:

void deleteVectorFW( const std::vector<ListType>& list )
	{
		for ( size_t i = 0, count = list.size(); i < count; ++i)
		{
			ListType listItem = list[i];
			FW_DELETE listItem;
		}
	}